

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedSSOSubroutine::Run(AdvancedSSOSubroutine *this)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  GLsizei width;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  GLint GVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 extraout_EAX_04;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  int layer;
  char *pcVar15;
  int layer_1;
  uint uVar16;
  long lVar17;
  vec4 c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint indices [2];
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar1 = this->m_program;
  GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image0");
  glu::CallLogWrapper::glProgramUniform1i(this_00,GVar1,GVar8,1);
  GVar1 = this->m_program;
  GVar8 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image1");
  glu::CallLogWrapper::glProgramUniform1i(this_00,GVar1,GVar8,1);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2601);
  iVar9 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x8c1a,0,0x8814,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar9) + 4),3,0,
             0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glGetIntegerv(this_00,0xc01,&this->m_draw_buffer);
  glu::CallLogWrapper::glDrawBuffer(this_00,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture,0,'\x01',0,0x88ba,0x8814);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_attribless_vao);
  indices[0] = glu::CallLogWrapper::glGetSubroutineIndex(this_00,this->m_program,0x8b30,"Brush0");
  indices[1] = glu::CallLogWrapper::glGetSubroutineIndex(this_00,this->m_program,0x8b30,"Brush1");
  glu::CallLogWrapper::glUniformSubroutinesuiv(this_00,0x8b30,1,indices);
  glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(this_00,4,0,3,1,0);
  iVar9 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = *(int *)CONCAT44(extraout_var_01,iVar9);
  iVar10 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
             m_renderCtx->_vptr_RenderContext[4])();
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,(long)(iVar9 * *(int *)(CONCAT44(extraout_var_02,iVar10) + 4) * 3),
             (allocator_type *)&c);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  iVar9 = 0;
  glu::CallLogWrapper::glGetTexImage
            (this_00,0x8c1a,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  do {
    if (iVar9 == 3) {
      glu::CallLogWrapper::glUniformSubroutinesuiv(this_00,0x8b30,1,indices + 1);
      glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(this_00,4,0,3,1,0);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
      lVar17 = 0;
      glu::CallLogWrapper::glGetTexImage
                (this_00,0x8c1a,0,0x1908,0x1406,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
        iVar9 = 0;
        while( true ) {
          iVar10 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                     m_context)->m_renderCtx->_vptr_RenderContext[4])();
          if (*(int *)(CONCAT44(extraout_var_08,iVar10) + 4) <= iVar9) break;
          iVar10 = 0;
          while( true ) {
            iVar11 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            if (*(int *)CONCAT44(extraout_var_09,iVar11) <= iVar10) break;
            iVar11 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar11 = *(int *)CONCAT44(extraout_var_10,iVar11);
            iVar12 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar12 = *(int *)(CONCAT44(extraout_var_11,iVar12) + 4);
            iVar13 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context)->m_renderCtx->_vptr_RenderContext[4])();
            tcu::Vector<float,_4>::Vector
                      (&c,data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          (int)(*(int *)CONCAT44(extraout_var_12,iVar13) * iVar9 + iVar10 +
                               iVar12 * uVar16 * iVar11));
            if (uVar16 == 2) {
              tcu::Vector<float,_4>::Vector(&local_98,&c);
              auVar7._4_4_ = -(uint)(local_98.m_data[1] != 0.0);
              auVar7._0_4_ = -(uint)(local_98.m_data[0] != 1.0);
              auVar7._8_4_ = -(uint)(local_98.m_data[2] != 0.0);
              auVar7._12_4_ = -(uint)(local_98.m_data[3] != 1.0);
              iVar11 = movmskps(extraout_EAX_04,auVar7);
              if (iVar11 != 0) {
                pcVar15 = "Color is (%f %f %f %f) should be (1 0 0 1)\n";
LAB_00a5640e:
                anon_unknown_0::Output
                          (pcVar15,SUB84((double)c.m_data[0],0),(double)c.m_data[1],
                           (double)c.m_data[2],(double)c.m_data[3]);
                lVar17 = -(ulong)(uVar16 < 3);
                goto LAB_00a5623a;
              }
            }
            else if (uVar16 == 1) {
              tcu::Vector<float,_4>::Vector(&local_88,&c);
              auVar6._4_4_ = -(uint)(local_88.m_data[1] != 0.0);
              auVar6._0_4_ = -(uint)(local_88.m_data[0] != 0.0);
              auVar6._8_4_ = -(uint)(local_88.m_data[2] != 1.0);
              auVar6._12_4_ = -(uint)(local_88.m_data[3] != 1.0);
              iVar11 = movmskps(extraout_EAX_03,auVar6);
              if (iVar11 != 0) {
                pcVar15 = "Color is (%f %f %f %f) should be (0 0 1 1)\n";
                goto LAB_00a5640e;
              }
            }
            else if (uVar16 == 0) {
              tcu::Vector<float,_4>::Vector(&local_78,&c);
              auVar5._4_4_ = -(uint)(local_78.m_data[1] != 1.0);
              auVar5._0_4_ = -(uint)(local_78.m_data[0] != 0.0);
              auVar5._8_4_ = -(uint)(local_78.m_data[2] != 0.0);
              auVar5._12_4_ = -(uint)(local_78.m_data[3] != 1.0);
              iVar11 = movmskps(extraout_EAX_02,auVar5);
              if (iVar11 != 0) {
                pcVar15 = "Color is (%f %f %f %f) should be (0 1 0 1)\n";
                goto LAB_00a5640e;
              }
            }
            iVar10 = iVar10 + 1;
          }
          iVar9 = iVar9 + 1;
        }
      }
LAB_00a5623a:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return lVar17;
    }
    iVar10 = 0;
    while( true ) {
      iVar11 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context
                 )->m_renderCtx->_vptr_RenderContext[4])();
      if (*(int *)(CONCAT44(extraout_var_03,iVar11) + 4) <= iVar10) break;
      iVar11 = 0;
      while( true ) {
        iVar12 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        if (*(int *)CONCAT44(extraout_var_04,iVar12) <= iVar11) break;
        iVar12 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar12 = *(int *)CONCAT44(extraout_var_05,iVar12);
        iVar13 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar13 = *(int *)(CONCAT44(extraout_var_06,iVar13) + 4);
        iVar14 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   m_context)->m_renderCtx->_vptr_RenderContext[4])();
        tcu::Vector<float,_4>::Vector
                  (&c,data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      (*(int *)CONCAT44(extraout_var_07,iVar14) * iVar10 + iVar11 +
                      iVar13 * iVar9 * iVar12));
        if (iVar9 == 2) {
          tcu::Vector<float,_4>::Vector(&local_68,&c);
          auVar4._4_4_ = -(uint)(local_68.m_data[1] != 0.0);
          auVar4._0_4_ = -(uint)(local_68.m_data[0] != 0.0);
          auVar4._8_4_ = -(uint)(local_68.m_data[2] != 1.0);
          auVar4._12_4_ = -(uint)(local_68.m_data[3] != 1.0);
          iVar12 = movmskps(extraout_EAX_01,auVar4);
          if (iVar12 != 0) {
            pcVar15 = "Color is (%f %f %f %f) should be (0 0 1 1)\n";
LAB_00a56217:
            anon_unknown_0::Output
                      (pcVar15,SUB84((double)c.m_data[0],0),(double)c.m_data[1],(double)c.m_data[2],
                       (double)c.m_data[3]);
            lVar17 = -1;
            goto LAB_00a5623a;
          }
        }
        else if (iVar9 == 1) {
          tcu::Vector<float,_4>::Vector(&local_58,&c);
          auVar3._4_4_ = -(uint)(local_58.m_data[1] != 1.0);
          auVar3._0_4_ = -(uint)(local_58.m_data[0] != 0.0);
          auVar3._8_4_ = -(uint)(local_58.m_data[2] != 0.0);
          auVar3._12_4_ = -(uint)(local_58.m_data[3] != 1.0);
          iVar12 = movmskps(extraout_EAX_00,auVar3);
          if (iVar12 != 0) {
            pcVar15 = "Color is (%f %f %f %f) should be (0 1 0 1)\n";
            goto LAB_00a56217;
          }
        }
        else if (iVar9 == 0) {
          tcu::Vector<float,_4>::Vector(&local_48,&c);
          auVar2._4_4_ = -(uint)(local_48.m_data[1] != 0.0);
          auVar2._0_4_ = -(uint)(local_48.m_data[0] != 1.0);
          auVar2._8_4_ = -(uint)(local_48.m_data[2] != 0.0);
          auVar2._12_4_ = -(uint)(local_48.m_data[3] != 1.0);
          iVar12 = movmskps(extraout_EAX,auVar2);
          if (iVar12 != 0) {
            pcVar15 = "Color is (%f %f %f %f) should be (1 0 0 1)\n";
            goto LAB_00a56217;
          }
        }
        iVar11 = iVar11 + 1;
      }
      iVar10 = iVar10 + 1;
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image0"), 1);
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image1"), 1);

		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 3, 0, GL_RGBA, GL_FLOAT,
					 NULL);

		glGetIntegerv(GL_DRAW_BUFFER, &m_draw_buffer);

		glDrawBuffer(GL_NONE);
		glBindImageTexture(1, m_texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_RGBA32F);
		glUseProgram(m_program);
		glBindVertexArray(m_attribless_vao);

		const GLuint indices[2] = { glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush0"),
									glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush1") };

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[0]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		std::vector<vec4> data(getWindowWidth() * getWindowHeight() * 3);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[1]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}
		return NO_ERROR;
	}